

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_encode_ext_safe(char *data,ptrdiff_t *data_sz,int8_t type,char *str,uint32_t len)

{
  uint32_t uVar1;
  char *__dest;
  
  if (data_sz != (ptrdiff_t *)0x0) {
    uVar1 = mp_sizeof_ext(len);
    *data_sz = *data_sz - (ulong)uVar1;
    if (*data_sz < 0) {
      return data;
    }
  }
  __dest = mp_encode_extl(data,type,len);
  memcpy(__dest,str,(ulong)len);
  return __dest + len;
}

Assistant:

MP_IMPL char *
mp_encode_ext_safe(char *data, ptrdiff_t *data_sz,
		   int8_t type, const char *str, uint32_t len)
{
	if (data_sz != NULL) {
		*data_sz -= mp_sizeof_ext(len);
		if (*data_sz < 0)
			return data;
	}
	return mp_encode_ext(data, type, str, len);
}